

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::RuntimeImp::RuntimeImp(RuntimeImp *this,shared_ptr<chatra::IHost> *host)

{
  long lVar1;
  shared_ptr<chatra::IHost> *host_local;
  RuntimeImp *this_local;
  
  Runtime::Runtime(&this->super_Runtime);
  IErrorReceiver::IErrorReceiver(&this->super_IErrorReceiver);
  IConcurrentGcConfiguration::IConcurrentGcConfiguration(&this->super_IConcurrentGcConfiguration);
  debugger::IDebugger::IDebugger(&this->super_IDebugger);
  (this->super_Runtime)._vptr_Runtime = (_func_int **)&PTR__RuntimeImp_0042a0d8;
  (this->super_IErrorReceiver)._vptr_IErrorReceiver = (_func_int **)&DAT_0042a210;
  (this->super_IConcurrentGcConfiguration)._vptr_IConcurrentGcConfiguration =
       (_func_int **)&PTR__RuntimeImp_0042a238;
  (this->super_IDebugger)._vptr_IDebugger = (_func_int **)&PTR__RuntimeImp_0042a270;
  std::weak_ptr<chatra::RuntimeImp>::weak_ptr(&this->self);
  LOCK();
  UNLOCK();
  lVar1 = lastRuntimeId + 1;
  this->runtimeId = lastRuntimeId;
  lastRuntimeId = lVar1;
  std::shared_ptr<chatra::IHost>::shared_ptr(&this->host,host);
  this->multiThread = false;
  this->closed = false;
  this->parserErrorRaised = false;
  std::atomic<bool>::atomic(&this->attemptToShutdown,false);
  std::shared_ptr<chatra::StringTable>::shared_ptr(&this->primarySTable);
  SpinLock::SpinLock(&this->lockSTable);
  std::shared_ptr<chatra::StringTable>::shared_ptr(&this->distributedSTable);
  ParserWorkingSet::ParserWorkingSet(&this->parserWs);
  std::shared_ptr<chatra::Storage>::shared_ptr(&this->storage);
  std::atomic<int>::atomic(&this->gcWaitCount,0);
  std::mutex::mutex(&this->mtGc);
  std::unique_ptr<chatra::Instance,std::default_delete<chatra::Instance>>::
  unique_ptr<std::default_delete<chatra::Instance>,void>
            ((unique_ptr<chatra::Instance,std::default_delete<chatra::Instance>> *)&this->gcInstance
            );
  std::unique_ptr<chatra::Thread,std::default_delete<chatra::Thread>>::
  unique_ptr<std::default_delete<chatra::Thread>,void>
            ((unique_ptr<chatra::Thread,std::default_delete<chatra::Thread>> *)&this->gcThread);
  IdPool<chatra::PackageId,_chatra::Package>::IdPool(&this->packageIds);
  IdPool<chatra::InstanceId,_chatra::Instance>::IdPool(&this->instanceIds);
  IdPool<chatra::Requester,_chatra::Thread>::IdPool(&this->threadIds);
  SpinLock::SpinLock(&this->lockScope);
  std::unique_ptr<chatra::Scope,std::default_delete<chatra::Scope>>::
  unique_ptr<std::default_delete<chatra::Scope>,void>
            ((unique_ptr<chatra::Scope,std::default_delete<chatra::Scope>> *)&this->scope);
  std::vector<chatra::Reference,_std::allocator<chatra::Reference>_>::vector(&this->recycledRefs);
  std::mutex::mutex(&this->mtLoadPackage);
  SpinLock::SpinLock(&this->lockPackages);
  std::
  unordered_map<chatra::PackageId,_std::unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_>,_std::hash<chatra::PackageId>,_std::equal_to<chatra::PackageId>,_std::allocator<std::pair<const_chatra::PackageId,_std::unique_ptr<chatra::Package,_std::default_delete<chatra::Package>_>_>_>_>
  ::unordered_map(&this->packages);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::PackageId>_>_>
  ::unordered_map(&this->packageIdByName);
  ClassTable::ClassTable(&this->classes);
  MethodTable::MethodTable(&this->methods);
  AsyncOperatorTable::AsyncOperatorTable(&this->operators);
  std::deque<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>::deque(&this->queue);
  SpinLock::SpinLock(&this->lockQueue);
  std::mutex::mutex(&this->mtQueue);
  std::condition_variable::condition_variable(&this->cvQueue);
  std::condition_variable::condition_variable(&this->cvShutdown);
  this->targetWorkerThreads = 0;
  this->nextId = 0;
  std::
  unordered_map<unsigned_int,_std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>_>
  ::unordered_map(&this->workerThreads);
  std::atomic<bool>::atomic(&this->hasWaitingThreads,false);
  SpinLock::SpinLock(&this->lockWaitingThreads);
  std::
  unordered_map<unsigned_int,_chatra::Thread_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_chatra::Thread_*>_>_>
  ::unordered_map(&this->waitingThreads);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->recycledWaitingIds);
  SpinLock::SpinLock(&this->lockTimers);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<chatra::Timer,_std::default_delete<chatra::Timer>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<chatra::Timer,_std::default_delete<chatra::Timer>_>_>_>_>
  ::unordered_map(&this->timers);
  std::vector<chatra::Timer_*,_std::allocator<chatra::Timer_*>_>::vector(&this->idToTimer);
  std::
  unordered_map<unsigned_int,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>
  ::unordered_map(&this->sleepRequests);
  this->finalizerThread = (Thread *)0x0;
  SpinLock::SpinLock(&this->lockFinalizerTemporary);
  MethodTableCache::MethodTableCache(&this->methodTableCache);
  SpinLock::SpinLock(&this->lockDrivers);
  std::
  unordered_map<chatra::DriverType,_std::unique_ptr<chatra::IDriver,_std::default_delete<chatra::IDriver>_>,_std::hash<chatra::DriverType>,_std::equal_to<chatra::DriverType>,_std::allocator<std::pair<const_chatra::DriverType,_std::unique_ptr<chatra::IDriver,_std::default_delete<chatra::IDriver>_>_>_>_>
  ::unordered_map(&this->drivers);
  std::shared_ptr<chatra::debugger::IDebuggerHost>::shared_ptr(&this->debuggerHost);
  std::mutex::mutex(&this->lockDebugger);
  this->paused = false;
  this->previousWorkerThreads = 0;
  std::
  unordered_map<chatra::debugger::BreakPointId,_chatra::BreakPoint,_std::hash<chatra::debugger::BreakPointId>,_std::equal_to<chatra::debugger::BreakPointId>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>_>
  ::unordered_map(&this->breakPoints);
  this->nextBreakPointId = 0;
  SpinLock::SpinLock(&this->lockTrashNodes);
  std::forward_list<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ::forward_list(&this->trashNodes);
  return;
}

Assistant:

RuntimeImp::RuntimeImp(std::shared_ptr<IHost> host) noexcept
		: runtimeId(static_cast<RuntimeId>(lastRuntimeId.fetch_add(1))),
		host(std::move(host)), methods(MethodTable::ForEmbeddedMethods()) {
}